

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_op.hpp
# Opt level: O0

want __thiscall
asio::ssl::detail::read_op<asio::mutable_buffers_1>::operator()
          (read_op<asio::mutable_buffers_1> *this,engine *eng,error_code *ec,
          size_t *bytes_transferred)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  engine *in_RSI;
  mutable_buffers_1 *in_RDI;
  mutable_buffer buffer;
  mutable_buffer local_30;
  size_t local_20;
  void *local_18;
  engine *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = asio::detail::buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::
             first(in_RDI);
  sVar1 = engine::read(local_10,(int)&local_30,local_18,local_20);
  return (want)sVar1;
}

Assistant:

engine::want operator()(engine& eng,
      asio::error_code& ec,
      std::size_t& bytes_transferred) const
  {
    asio::mutable_buffer buffer =
      asio::detail::buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence>::first(buffers_);

    return eng.read(buffer, ec, bytes_transferred);
  }